

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainNamingConventions.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char **__args;
  long lVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (1 < (uint)argc) {
    __args = argv + 1;
    lVar1 = (ulong)(uint)argc - 1;
    do {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
                 __args);
      __args = __args + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  namingConventions::convertToConventions(&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  return 0;
}

Assistant:

int main(int argc, char** argv){
std::vector<std::string> filenames;

    for (unsigned int file = 1; file < argc; ++file) {
        filenames.emplace_back(argv[file]);
    }
    namingConventions::convertToConventions(filenames);

//    namingConventions::namingConventionsClasses(filenames);
//    namingConventions::namingConventionsVariables(filenames);
//    namingConventions::namingConventionsFunctions(filenames);

}